

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixNormalsStep.cpp
# Opt level: O1

bool __thiscall
Assimp::FixInfacingNormalsProcess::ProcessMesh
          (FixInfacingNormalsProcess *this,aiMesh *pcMesh,uint index)

{
  uint uVar1;
  aiVector3D *paVar2;
  aiVector3D *paVar3;
  uint *puVar4;
  bool bVar5;
  Logger *this_00;
  ulong uVar6;
  aiFace *paVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/FixNormalsStep.cpp"
                  ,0x69,
                  "bool Assimp::FixInfacingNormalsProcess::ProcessMesh(aiMesh *, unsigned int)");
  }
  paVar2 = pcMesh->mNormals;
  if (pcMesh->mNumVertices != 0 && paVar2 != (aiVector3D *)0x0) {
    paVar3 = pcMesh->mVertices;
    lVar9 = 0;
    fVar13 = 1e+10;
    fVar14 = 1e+10;
    fVar18 = 1e+10;
    fVar20 = 1e+10;
    fVar22 = 1e+10;
    fVar24 = -1e+10;
    fVar25 = -1e+10;
    fVar26 = -1e+10;
    fVar28 = -1e+10;
    fVar30 = -1e+10;
    fVar32 = -1e+10;
    fVar34 = 1e+10;
    do {
      fVar16 = *(float *)((long)&paVar3->x + lVar9);
      fVar15 = *(float *)((long)&paVar3->y + lVar9);
      fVar17 = fVar16;
      if (fVar14 <= fVar16) {
        fVar17 = fVar14;
      }
      fVar23 = fVar15;
      if (fVar22 <= fVar15) {
        fVar23 = fVar22;
      }
      fVar33 = *(float *)((long)&paVar3->z + lVar9);
      fVar12 = fVar33;
      if (fVar13 <= fVar33) {
        fVar12 = fVar13;
      }
      fVar27 = fVar16;
      if (fVar16 <= fVar26) {
        fVar27 = fVar26;
      }
      fVar31 = fVar15;
      if (fVar15 <= fVar30) {
        fVar31 = fVar30;
      }
      fVar16 = fVar16 + *(float *)((long)&paVar2->x + lVar9);
      fVar15 = fVar15 + *(float *)((long)&paVar2->y + lVar9);
      fVar29 = fVar33 + *(float *)((long)&paVar2->z + lVar9);
      if (fVar33 <= fVar32) {
        fVar33 = fVar32;
      }
      fVar35 = fVar16;
      if (fVar34 <= fVar16) {
        fVar35 = fVar34;
      }
      fVar21 = fVar15;
      if (fVar20 <= fVar15) {
        fVar21 = fVar20;
      }
      fVar19 = fVar29;
      if (fVar18 <= fVar29) {
        fVar19 = fVar18;
      }
      if (fVar16 <= fVar25) {
        fVar16 = fVar25;
      }
      if (fVar15 <= fVar24) {
        fVar15 = fVar24;
      }
      if (fVar29 <= fVar28) {
        fVar29 = fVar28;
      }
      lVar9 = lVar9 + 0xc;
      fVar13 = fVar12;
      fVar14 = fVar17;
      fVar18 = fVar19;
      fVar20 = fVar21;
      fVar22 = fVar23;
      fVar24 = fVar15;
      fVar25 = fVar16;
      fVar26 = fVar27;
      fVar28 = fVar29;
      fVar30 = fVar31;
      fVar32 = fVar33;
      fVar34 = fVar35;
    } while ((ulong)pcMesh->mNumVertices * 0xc != lVar9);
    fVar27 = fVar27 - fVar17;
    if (fVar27 <= 0.0 != 0.0 < fVar16 - fVar35) {
      fVar31 = fVar31 - fVar23;
      if (0.0 < fVar15 - fVar21 != fVar31 <= 0.0) {
        fVar33 = fVar33 - fVar12;
        if (0.0 < fVar29 - fVar19 != fVar33 <= 0.0) {
          fVar13 = fVar31 * fVar33;
          if (fVar13 < 0.0) {
            fVar14 = sqrtf(fVar13);
          }
          else {
            fVar14 = SQRT(fVar13);
          }
          if (fVar14 * 0.05 <= fVar27) {
            fVar14 = fVar27 * fVar33;
            if (fVar14 < 0.0) {
              fVar14 = sqrtf(fVar14);
            }
            else {
              fVar14 = SQRT(fVar14);
            }
            if (fVar14 * 0.05 <= fVar31) {
              fVar31 = fVar31 * fVar27;
              if (fVar31 < 0.0) {
                fVar31 = sqrtf(fVar31);
              }
              else {
                fVar31 = SQRT(fVar31);
              }
              if ((fVar31 * 0.05 <= fVar33) &&
                 (ABS((fVar29 - fVar19) * (fVar15 - fVar21) * (fVar16 - fVar35)) <
                  ABS(fVar27 * fVar13))) {
                bVar5 = DefaultLogger::isNullLogger();
                if (!bVar5) {
                  this_00 = DefaultLogger::get();
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  basic_formatter<char[6]>
                            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *
                             )local_1a0,(char (*) [6])0x6e994b);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,
                             ": Normals are facing inwards (or the mesh is planar)",0x34);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
                  std::__cxx11::stringbuf::str();
                  Logger::info(this_00,(char *)local_1c0);
                  if (local_1c0 != local_1b0) {
                    operator_delete(local_1c0,local_1b0[0] + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
                  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
                }
                if (pcMesh->mNumVertices != 0) {
                  lVar9 = 8;
                  uVar6 = 0;
                  do {
                    paVar2 = pcMesh->mNormals;
                    uVar8 = *(uint *)((long)&paVar2->x + lVar9);
                    *(uint *)((long)paVar2 + lVar9 + -8) =
                         *(uint *)((long)paVar2 + lVar9 + -8) ^ 0x80000000;
                    *(uint *)((long)paVar2 + lVar9 + -4) =
                         *(uint *)((long)paVar2 + lVar9 + -4) ^ 0x80000000;
                    *(uint *)((long)&paVar2->x + lVar9) = uVar8 ^ 0x80000000;
                    uVar6 = uVar6 + 1;
                    lVar9 = lVar9 + 0xc;
                  } while (uVar6 < pcMesh->mNumVertices);
                }
                if (pcMesh->mNumFaces == 0) {
                  return true;
                }
                uVar6 = 0;
                do {
                  uVar8 = pcMesh->mFaces[uVar6].mNumIndices;
                  if (1 < uVar8) {
                    paVar7 = pcMesh->mFaces + uVar6;
                    iVar10 = -1;
                    uVar11 = 0;
                    do {
                      puVar4 = paVar7->mIndices;
                      uVar1 = puVar4[uVar11];
                      puVar4[uVar11] = puVar4[uVar8 + iVar10];
                      puVar4[uVar8 + iVar10] = uVar1;
                      uVar11 = uVar11 + 1;
                      uVar8 = paVar7->mNumIndices;
                      iVar10 = iVar10 + -1;
                    } while (uVar11 < uVar8 >> 1);
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar6 < pcMesh->mNumFaces);
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool FixInfacingNormalsProcess::ProcessMesh( aiMesh* pcMesh, unsigned int index)
{
    ai_assert(nullptr != pcMesh);

    // Nothing to do if there are no model normals
    if (!pcMesh->HasNormals()) {
        return false;
    }

    // Compute the bounding box of both the model vertices + normals and
    // the unmodified model vertices. Then check whether the first BB
    // is smaller than the second. In this case we can assume that the
    // normals need to be flipped, although there are a few special cases ..
    // convex, concave, planar models ...

    aiVector3D vMin0 (1e10f,1e10f,1e10f);
    aiVector3D vMin1 (1e10f,1e10f,1e10f);
    aiVector3D vMax0 (-1e10f,-1e10f,-1e10f);
    aiVector3D vMax1 (-1e10f,-1e10f,-1e10f);

    for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
    {
        vMin1.x = std::min(vMin1.x,pcMesh->mVertices[i].x);
        vMin1.y = std::min(vMin1.y,pcMesh->mVertices[i].y);
        vMin1.z = std::min(vMin1.z,pcMesh->mVertices[i].z);

        vMax1.x = std::max(vMax1.x,pcMesh->mVertices[i].x);
        vMax1.y = std::max(vMax1.y,pcMesh->mVertices[i].y);
        vMax1.z = std::max(vMax1.z,pcMesh->mVertices[i].z);

        const aiVector3D vWithNormal = pcMesh->mVertices[i] + pcMesh->mNormals[i];

        vMin0.x = std::min(vMin0.x,vWithNormal.x);
        vMin0.y = std::min(vMin0.y,vWithNormal.y);
        vMin0.z = std::min(vMin0.z,vWithNormal.z);

        vMax0.x = std::max(vMax0.x,vWithNormal.x);
        vMax0.y = std::max(vMax0.y,vWithNormal.y);
        vMax0.z = std::max(vMax0.z,vWithNormal.z);
    }

    const float fDelta0_x = (vMax0.x - vMin0.x);
    const float fDelta0_y = (vMax0.y - vMin0.y);
    const float fDelta0_z = (vMax0.z - vMin0.z);

    const float fDelta1_x = (vMax1.x - vMin1.x);
    const float fDelta1_y = (vMax1.y - vMin1.y);
    const float fDelta1_z = (vMax1.z - vMin1.z);

    // Check whether the boxes are overlapping
    if ((fDelta0_x > 0.0f) != (fDelta1_x > 0.0f))return false;
    if ((fDelta0_y > 0.0f) != (fDelta1_y > 0.0f))return false;
    if ((fDelta0_z > 0.0f) != (fDelta1_z > 0.0f))return false;

    // Check whether this is a planar surface
    const float fDelta1_yz = fDelta1_y * fDelta1_z;

    if (fDelta1_x < 0.05f * std::sqrt( fDelta1_yz ))return false;
    if (fDelta1_y < 0.05f * std::sqrt( fDelta1_z * fDelta1_x ))return false;
    if (fDelta1_z < 0.05f * std::sqrt( fDelta1_y * fDelta1_x ))return false;

    // now compare the volumes of the bounding boxes
    if (std::fabs(fDelta0_x * fDelta0_y * fDelta0_z) < std::fabs(fDelta1_x * fDelta1_yz)) {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_INFO_F("Mesh ", index, ": Normals are facing inwards (or the mesh is planar)", index);
        }

        // Invert normals
        for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
            pcMesh->mNormals[i] *= -1.0f;

        // ... and flip faces
        for (unsigned int i = 0; i < pcMesh->mNumFaces;++i)
        {
            aiFace& face = pcMesh->mFaces[i];
            for( unsigned int b = 0; b < face.mNumIndices / 2; b++)
                std::swap( face.mIndices[b], face.mIndices[ face.mNumIndices - 1 - b]);
        }
        return true;
    }
    return false;
}